

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporterDisposer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::DefaultReporterDisposer::DefaultReporterDisposer
          (DefaultReporterDisposer *this,shared_ptr<ApprovalTests::Reporter> *reporter)

{
  __shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->previous_result).super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->previous_result).super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  DefaultReporterFactory::getDefaultReporter();
  ::std::__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_20._M_refcount);
  DefaultReporterFactory::setDefaultReporter(reporter);
  return;
}

Assistant:

DefaultReporterDisposer::DefaultReporterDisposer(
        const std::shared_ptr<Reporter>& reporter)
    {
        previous_result = DefaultReporterFactory::getDefaultReporter();
        DefaultReporterFactory::setDefaultReporter(reporter);
    }